

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O2

int CfdCreateAddress(void *handle,int hash_type,char *pubkey,char *redeem_script,int network_type,
                    char **address,char **locking_script,char **p2sh_segwit_locking_script)

{
  bool bVar1;
  NetType type;
  AddressType address_type;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  CfdException *this;
  AddressFactory *this_00;
  bool is_bitcoin;
  allocator local_4a2;
  allocator local_4a1;
  void *local_4a0;
  AddressFactory factory;
  char *work_locking_script;
  char *work_address;
  Pubkey pubkey_obj;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_440;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_428;
  undefined1 local_410 [48];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3e0;
  Script lock_script;
  Script script;
  Script unlocking_script;
  Address local_320;
  Address addr;
  
  local_4a0 = handle;
  cfd::Initialize();
  if (address == (char **)0x0) {
    addr._0_8_ = (long)
                 "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
                 + 0x56;
    addr.witness_ver_ = 0x8f;
    addr.address_._M_dataplus._M_p = "CfdCreateAddress";
    cfd::core::logger::warn<>((CfdSourceLocation *)&addr,"address is null.");
    this = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&addr,"Failed to parameter. address is null.",(allocator *)&local_320);
    cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&addr);
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  is_bitcoin = false;
  type = cfd::capi::ConvertNetType(network_type,&is_bitcoin);
  cfd::core::Address::Address(&addr);
  address_type = cfd::capi::ConvertHashToAddressType(hash_type);
  cfd::core::Pubkey::Pubkey(&pubkey_obj);
  cfd::core::Script::Script(&script);
  cfd::core::Script::Script(&lock_script);
  cfd::core::Script::Script(&unlocking_script);
  if ((pubkey != (char *)0x0) && (*pubkey != '\0')) {
    if (address_type == kTaprootAddress) {
      std::__cxx11::string::string((string *)&local_320,"02",&local_4a1);
      cfd::core::ByteData::ByteData((ByteData *)local_410,(string *)&local_320);
      std::__cxx11::string::string((string *)&factory,pubkey,&local_4a2);
      cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&local_440,(string *)&factory);
      cfd::core::SchnorrPubkey::GetData((ByteData *)&local_428,(SchnorrPubkey *)&local_440);
      cfd::core::ByteData::Concat<cfd::core::ByteData>
                ((ByteData *)(local_410 + 0x18),(ByteData *)local_410,(ByteData *)&local_428);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_3e0,(ByteData *)(local_410 + 0x18));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_obj,&local_3e0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3e0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(local_410 + 0x18));
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_428);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_440);
      std::__cxx11::string::~string((string *)&factory);
      this_00 = (AddressFactory *)local_410;
    }
    else {
      std::__cxx11::string::string((string *)&local_320,pubkey,(allocator *)&local_3e0);
      cfd::core::Pubkey::Pubkey((Pubkey *)&factory,(string *)&local_320);
      this_00 = &factory;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_obj,this_00);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
    std::__cxx11::string::~string((string *)&local_320);
  }
  if ((redeem_script != (char *)0x0) && (*redeem_script != '\0')) {
    std::__cxx11::string::string((string *)&factory,redeem_script,(allocator *)&local_3e0);
    cfd::core::Script::Script((Script *)&local_320,(string *)&factory);
    cfd::core::Script::operator=(&script,(Script *)&local_320);
    cfd::core::Script::~Script((Script *)&local_320);
    std::__cxx11::string::~string((string *)&factory);
  }
  if (is_bitcoin == true) {
    cfd::AddressFactory::AddressFactory(&factory,type);
    cfd::AddressFactory::CreateAddress
              (&local_320,&factory,address_type,&pubkey_obj,&script,&lock_script,&unlocking_script);
    cfd::core::Address::operator=(&addr,&local_320);
  }
  else {
    cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)&factory,type);
    cfd::AddressFactory::CreateAddress
              (&local_320,&factory,address_type,&pubkey_obj,&script,&lock_script,&unlocking_script);
    cfd::core::Address::operator=(&addr,&local_320);
  }
  cfd::core::Address::~Address(&local_320);
  cfd::AddressFactory::~AddressFactory(&factory);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&local_320,&addr);
  pcVar2 = cfd::capi::CreateString((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  if (locking_script == (char **)0x0) {
LAB_0035206b:
    pcVar3 = (char *)0x0;
  }
  else {
    bVar1 = cfd::core::Script::IsEmpty(&lock_script);
    if (bVar1) goto LAB_0035206b;
    cfd::core::Script::GetHex_abi_cxx11_((string *)&local_320,&lock_script);
    pcVar3 = cfd::capi::CreateString((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_320);
  }
  if (p2sh_segwit_locking_script != (char **)0x0) {
    bVar1 = cfd::core::Script::IsEmpty(&unlocking_script);
    if (!bVar1) {
      cfd::core::Script::GetHex_abi_cxx11_((string *)&local_320,&unlocking_script);
      pcVar4 = cfd::capi::CreateString((string *)&local_320);
      std::__cxx11::string::~string((string *)&local_320);
      goto LAB_003520fc;
    }
  }
  pcVar4 = (char *)0x0;
LAB_003520fc:
  *address = pcVar2;
  if (pcVar3 != (char *)0x0) {
    *locking_script = pcVar3;
  }
  if (pcVar4 != (char *)0x0) {
    *p2sh_segwit_locking_script = pcVar4;
  }
  cfd::core::Script::~Script(&unlocking_script);
  cfd::core::Script::~Script(&lock_script);
  cfd::core::Script::~Script(&script);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_obj);
  cfd::core::Address::~Address(&addr);
  return 0;
}

Assistant:

int CfdCreateAddress(
    void* handle, int hash_type, const char* pubkey, const char* redeem_script,
    int network_type, char** address, char** locking_script,
    char** p2sh_segwit_locking_script) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_address = nullptr;
  char* work_locking_script = nullptr;
  char* work_p2sh_segwit_locking_script = nullptr;
  try {
    cfd::Initialize();
    if (address == nullptr) {
      warn(CFD_LOG_SOURCE, "address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. address is null.");
    }

    bool is_bitcoin = false;
    NetType net_type = cfd::capi::ConvertNetType(network_type, &is_bitcoin);
    Address addr;
    AddressType addr_type = ConvertHashToAddressType(hash_type);
    Pubkey pubkey_obj;
    Script script;
    Script lock_script;
    Script unlocking_script;

    if ((pubkey != nullptr) && (*pubkey != '\0')) {
      if (addr_type == AddressType::kTaprootAddress) {
        pubkey_obj =
            Pubkey(ByteData("02").Concat(SchnorrPubkey(pubkey).GetData()));
      } else {
        pubkey_obj = Pubkey(pubkey);
      }
    }
    if ((redeem_script != nullptr) && (*redeem_script != '\0')) {
      script = Script(redeem_script);
    }

    if (is_bitcoin) {
      AddressFactory factory(net_type);
      addr = factory.CreateAddress(
          addr_type, &pubkey_obj, &script, &lock_script, &unlocking_script);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ElementsAddressFactory factory(net_type);
      addr = factory.CreateAddress(
          addr_type, &pubkey_obj, &script, &lock_script, &unlocking_script);
#else
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Elements not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    work_address = CreateString(addr.GetAddress());
    if (locking_script != nullptr) {
      if (!lock_script.IsEmpty()) {
        work_locking_script = CreateString(lock_script.GetHex());
      }
    }
    if (p2sh_segwit_locking_script != nullptr) {
      if (!unlocking_script.IsEmpty()) {
        work_p2sh_segwit_locking_script =
            CreateString(unlocking_script.GetHex());
      }
    }

    *address = work_address;
    if (work_locking_script != nullptr) *locking_script = work_locking_script;
    if (work_p2sh_segwit_locking_script != nullptr)
      *p2sh_segwit_locking_script = work_p2sh_segwit_locking_script;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(
      &work_address, &work_locking_script, &work_p2sh_segwit_locking_script);
  return result;
}